

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_ogf.cxx
# Opt level: O0

void __thiscall xray_re::xr_ogf::clear(xr_ogf *this)

{
  xr_ogf *this_local;
  
  xr_object::clear(&this->super_xr_object);
  this->m_loaded = 0;
  std::__cxx11::string::clear();
  _aabb<float>::null(&this->m_bbox);
  _sphere<float>::reset(&this->m_bsphere);
  std::__cxx11::string::clear();
  std::__cxx11::string::clear();
  xr_vbuf::clear(&this->m_vb);
  xr_ibuf::clear(&this->m_ib);
  trim_container<std::vector<xray_re::xr_ogf*,std::allocator<xray_re::xr_ogf*>>>(&this->m_children);
  trim_container<std::vector<xray_re::xr_ogf*,std::allocator<xray_re::xr_ogf*>>>(&this->m_lods);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear(&this->m_children_l);
  return;
}

Assistant:

void xr_ogf::clear()
{
	xr_object::clear();
	m_loaded = 0;
	m_path.clear();
	m_bbox.null();
	m_bsphere.reset();
	m_texture.clear();
	m_shader.clear();
	m_vb.clear();
	m_ib.clear();
	trim_container(m_children);
	trim_container(m_lods);
	m_children_l.clear();
}